

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionJAOHTree.cpp
# Opt level: O0

void __thiscall QFunctionJAOHTree::Load(QFunctionJAOHTree *this,string *filename)

{
  PlanningUnitMADPDiscrete *this_00;
  QFunctionJAOHTree *in_RSI;
  long *in_RDI;
  QTable *in_stack_00000418;
  size_t in_stack_00000420;
  size_t in_stack_00000428;
  string *in_stack_00000430;
  
  if ((*(byte *)(in_RDI + 7) & 1) != 0) {
    Initialize(in_RSI);
  }
  this_00 = (PlanningUnitMADPDiscrete *)
            (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                      ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  PlanningUnitMADPDiscrete::GetNrJointActionObservationHistories(this_00);
  (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
            ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x8a2921);
  QTable::Load(in_stack_00000430,in_stack_00000428,in_stack_00000420,in_stack_00000418);
  return;
}

Assistant:

void QFunctionJAOHTree::Load(const string &filename)
{
    if(_m_initialized)
        Initialize();
#if 0 // don't use this, it makes a copy (so you need twice the memory)

    _m_QValues=MDPSolver::LoadQTable(filename,
                                     GetPU()->
                                     GetNrJointActionObservationHistories(),
                                     GetPU()->GetNrJointActions());
#else
    QTable::Load(filename,
                 GetPU()->GetNrJointActionObservationHistories(),
                 GetPU()->GetNrJointActions(),
                 _m_QValues);
#endif
}